

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::liftingForProbing(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  HighsMipSolverData *pHVar1;
  key_type *pkVar2;
  pointer ppVar3;
  HighsLp *pHVar4;
  pointer pdVar5;
  pointer end;
  HighsInt HVar6;
  _Base_ptr p_Var7;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *pvVar8;
  mapped_type *pmVar9;
  pointer ptVar10;
  long lVar11;
  tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *lifting;
  ulong uVar12;
  CliqueVar *cliquevar;
  key_type *pkVar13;
  int iVar14;
  const_iterator __begin2;
  pointer ppVar15;
  const_iterator __end2;
  __node_base *p_Var16;
  double dVar17;
  double dVar18;
  bool isredundant;
  bool dense;
  bool fillallowed;
  HighsInt row;
  double local_168;
  HighsInt bestnfill;
  double local_158;
  double bestscore;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range5;
  uint local_13c;
  double local_138;
  HighsDomain *local_130;
  pointer local_128;
  double bestscoretotal;
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  liftingtable;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> candidates;
  vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
  cliques;
  anon_class_8_1_0b815314 computeOverallScore;
  pointer ppStack_b0;
  map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
  coefficients;
  
  pHVar1 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  liftingtable.
  super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  liftingtable.
  super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  liftingtable.
  super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ::reserve(&liftingtable,(this->liftingOpportunities)._M_h._M_element_count);
  local_130 = &pHVar1->domain;
  bestscoretotal = -INFINITY;
  coefficients._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &coefficients._M_t._M_impl.super__Rb_tree_header._M_header;
  coefficients._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  coefficients._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  coefficients._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var16 = &(this->liftingOpportunities)._M_h._M_before_begin;
  local_13c = 0;
  coefficients._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       coefficients._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    end = liftingtable.
          super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    ptVar10 = liftingtable.
              super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      p_Var16 = p_Var16->_M_nxt;
      if (p_Var16 == (__node_base *)0x0) {
        computeOverallScore.bestscoretotal = &bestscoretotal;
        if (liftingtable.
            super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            liftingtable.
            super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar14 = pdqsort_detail::log2<long>
                             (((long)liftingtable.
                                     super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)liftingtable.
                                    super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x30);
          pdqsort_detail::
          pdqsort_loop<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4,false>
                    ((__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                      )ptVar10,
                     (__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                      )end,&computeOverallScore,iVar14,true);
          ptVar10 = liftingtable.
                    super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        dVar17 = (double)((((long)ptVar10 -
                           (long)liftingtable.
                                 super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x30) * 10);
        HVar6 = numNonzeros(this);
        uVar12 = 0;
        local_130 = (HighsDomain *)((ulong)(long)HVar6 / 100);
        if (local_130 <= (ulong)dVar17 && (long)dVar17 - (long)local_130 != 0) {
          local_130 = (HighsDomain *)dVar17;
        }
        local_128 = liftingtable.
                    super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        __range5 = (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    *)0x0;
        ptVar10 = liftingtable.
                  super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        dVar17 = 0.0;
        goto LAB_0030657b;
      }
      row = (HighsInt)*(size_type *)(p_Var16 + 1);
    } while ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start[row] != '\0');
    computeOverallScore.bestscoretotal = (double *)this;
    HighsHashTree<std::pair<int,_int>,_double>::
    for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HPresolve_cpp:1739:20)_&,_0>
              ((NodePtr)*(uintptr_t *)&((_Prime_rehash_policy *)(p_Var16 + 2))->_M_max_load_factor,
               (anon_class_64_8_9ac467b2 *)&computeOverallScore);
    if (coefficients._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      computeOverallScore.bestscoretotal = (double *)0x0;
      ppStack_b0 = (pointer)0x0;
      bestscore = -INFINITY;
      bestnfill = 0;
      candidates.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      candidates.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      candidates.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      reserve(&candidates,coefficients._M_t._M_impl.super__Rb_tree_header._M_node_count);
      for (p_Var7 = coefficients._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &coefficients._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        push_back(&candidates,(value_type *)(p_Var7 + 1));
        iVar14 = *(int *)&p_Var7[1]._M_left;
        if ((long)iVar14 == -1) {
          dVar17 = 0.0;
        }
        else {
          dVar17 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar14];
        }
        dVar17 = ABS((double)p_Var7[1]._M_parent - dVar17);
        if (bestscore < dVar17) {
          bestnfill = (HighsInt)(iVar14 == -1);
          cliques.
          super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = p_Var7[1]._M_color;
          bestscore = dVar17;
          cliques.
          super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var7[1]._M_parent;
          std::
          vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>
          ::_M_assign_aux<std::pair<HighsCliqueTable::CliqueVar,double>const*>
                    ((vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>
                      *)&computeOverallScore,&cliques,
                     &cliques.
                      super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      if (4 < (ulong)((long)candidates.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)candidates.
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        HighsCliqueTable::computeMaximalCliques
                  (&cliques,&pHVar1->cliquetable,&candidates,this->primal_feastol);
        local_128 = (pointer)cliques.
                             super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
        pvVar8 = (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)CONCAT44(cliques.
                             super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (_Rb_tree_color)
                             cliques.
                             super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        while ((pointer)pvVar8 != local_128) {
          pkVar13 = (pvVar8->
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pkVar2 = (pvVar8->
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          iVar14 = 0;
          local_168 = 0.0;
          local_158 = 0.0;
          __range5 = pvVar8;
          for (; pvVar8 = __range5, pkVar13 != pkVar2; pkVar13 = pkVar13 + 1) {
            pmVar9 = std::
                     map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                     ::operator[](&coefficients,pkVar13);
            dVar17 = pmVar9->first;
            pmVar9 = std::
                     map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                     ::operator[](&coefficients,pkVar13);
            if ((long)pmVar9->second == -1) {
              local_138 = 0.0;
            }
            else {
              local_138 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start[pmVar9->second];
            }
            pmVar9 = std::
                     map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                     ::operator[](&coefficients,pkVar13);
            dVar18 = ABS(dVar17 - local_138);
            dVar17 = local_168 + dVar18;
            local_158 = local_158 +
                        ((dVar17 - dVar18) - dVar17) + dVar18 + (local_168 - (dVar17 - dVar18));
            iVar14 = iVar14 + (uint)(pmVar9->second == -1);
            local_168 = dVar17;
          }
          if (bestscore < local_168 + local_158) {
            if (ppStack_b0 != (pointer)computeOverallScore.bestscoretotal) {
              ppStack_b0 = (pointer)computeOverallScore.bestscoretotal;
            }
            bestnfill = iVar14;
            bestscore = local_168 + local_158;
            std::
            vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
            ::reserve((vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                       *)&computeOverallScore,
                      (long)(__range5->
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(__range5->
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 2);
            pkVar2 = (pvVar8->
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (pkVar13 = (pvVar8->
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           )._M_impl.super__Vector_impl_data._M_start; pkVar13 != pkVar2;
                pkVar13 = pkVar13 + 1) {
              pmVar9 = std::
                       map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                       ::operator[](&coefficients,pkVar13);
              std::
              vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>
              ::emplace_back<HighsCliqueTable::CliqueVar_const&,double&>
                        ((vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>
                          *)&computeOverallScore,pkVar13,&pmVar9->first);
            }
          }
          pvVar8 = __range5 + 1;
        }
        std::
        vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
        ::~vector(&cliques);
      }
      std::
      vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>
      ::
      emplace_back<int&,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>&,double&,int&>
                ((vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>
                  *)&liftingtable,&row,
                 (vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                  *)&computeOverallScore,&bestscore,&bestnfill);
      dVar17 = bestscore;
      if (bestscore <= bestscoretotal) {
        dVar17 = bestscoretotal;
      }
      bestscoretotal = dVar17;
      std::
      map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
      ::clear(&coefficients);
      std::_Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      ~_Vector_base(&candidates.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   );
      std::
      _Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
      ::~_Vector_base((_Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                       *)&computeOverallScore);
    }
  } while( true );
LAB_0030657b:
  if (ptVar10 == local_128) {
LAB_003066ac:
    highsLogDev(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                "Lifting for probing removed %d and modified %d row(s), added %d new and modified %d existing nonzero(s)\n"
                ,(ulong)local_13c,uVar12,dVar17,(int)__range5);
    std::
    map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
    ::~map(&coefficients);
    std::
    vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
    ::~vector(&liftingtable);
    return kOk;
  }
  lVar11 = (long)(ptVar10->
                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 ).
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                 super__Head_base<3UL,_int,_false>._M_head_impl;
  dVar18 = (double)((long)dVar17 + lVar11);
  if (local_130 < (ulong)dVar18) goto LAB_003066ac;
  iVar14 = (ptVar10->
           super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           ).super__Head_base<0UL,_int,_false>._M_head_impl;
  ppVar15 = (ptVar10->
            super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            ).
            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            .
            super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
            ._M_head_impl.
            super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = *(pointer *)
            ((long)&(ptVar10->
                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    ).
                    super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    .
                    super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                    ._M_head_impl.
                    super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  __range5 = (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
             ((long)__range5 + (((long)ppVar3 - (long)ppVar15 >> 4) - lVar11));
  dVar17 = 0.0;
  local_168 = 0.0;
  local_138 = dVar18;
  for (; ppVar15 != ppVar3; ppVar15 = ppVar15 + 1) {
    local_158 = dVar17;
    addToMatrix(this,iVar14,(uint)ppVar15->first & 0x7fffffff,ppVar15->second);
    dVar17 = local_158;
    if (-1 < (int)ppVar15->first) {
      dVar17 = ppVar15->second;
      dVar18 = local_168 + dVar17;
      dVar17 = local_158 + (local_168 - (dVar18 - dVar17)) + (dVar17 - (dVar18 - (dVar18 - dVar17)))
      ;
      local_168 = dVar18;
    }
  }
  pHVar4 = this->model;
  pdVar5 = (pHVar4->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar18 = pdVar5[iVar14];
  if (-INFINITY < dVar18) {
    pdVar5[iVar14] = dVar18 + dVar17 + local_168;
  }
  pdVar5 = (pHVar4->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar18 = pdVar5[iVar14];
  if (dVar18 < INFINITY) {
    pdVar5[iVar14] = dVar17 + local_168 + dVar18;
  }
  uVar12 = (ulong)((int)uVar12 + 1);
  ptVar10 = ptVar10 + 1;
  dVar17 = local_138;
  goto LAB_0030657b;
}

Assistant:

HPresolve::Result HPresolve::liftingForProbing(
    HighsPostsolveStack& postsolve_stack) {
  // this method implements lifting for probing as described by Achterberg et
  // al. (2019) Presolve Reductions in Mixed Integer Programming. INFORMS
  // Journal on Computing 32(2):473-506.
  HighsCliqueTable& cliquetable = mipsolver->mipdata_->cliquetable;
  const HighsDomain& domain = mipsolver->mipdata_->domain;

  // collect best lifting opportunity for each row in a vector
  typedef std::pair<HighsCliqueTable::CliqueVar, double> liftingvar;
  typedef std::tuple<HighsInt, std::vector<liftingvar>, double, HighsInt>
      liftingdata;
  std::vector<liftingdata> liftingtable;
  liftingtable.reserve(liftingOpportunities.size());

  // remember overall best score
  double bestscoretotal = -kHighsInf;

  // is lifting allowed to add non-zeros?
  const bool fillallowed = mipsolver->options_mip_->mip_lifting_for_probing > 0;

  // store clique variables and coefficients in a map
  auto comp = [](const HighsCliqueTable::CliqueVar& c1,
                 const HighsCliqueTable::CliqueVar& c2) {
    return c1.col < c2.col || (c1.col == c2.col && c1.val < c2.val);
  };
  std::map<HighsCliqueTable::CliqueVar, std::pair<double, HighsInt>,
           decltype(comp)>
      coefficients(comp);

  // consider lifting opportunities
  size_t numrowsremoved = 0;
  for (const auto& elm : liftingOpportunities) {
    // get row index and skip deleted rows
    HighsInt row = elm.first;
    if (rowDeleted[row]) continue;

    // do not add non-zeros to dense rows
    const bool dense =
        rowsize[row] >
        std::max(HighsInt{1000}, (model->num_col_ - numDeletedCols) / 20);

    // iterate over elements in hash tree
    const auto& htree = elm.second;
    bool isredundant = false;
    htree.for_each([&](const std::pair<HighsInt, HighsInt>& data, double coef) {
      HighsInt col = data.first;
      HighsInt val = data.second;
      HighsInt pos = findNonzero(row, col);
      isredundant = isredundant || htree.contains(std::make_pair(col, 1 - val));
      if (!dense && (fillallowed || pos != -1) && !colDeleted[col] &&
          !domain.isFixed(col))
        coefficients[HighsCliqueTable::CliqueVar{col, val}] = {coef, pos};
    });

    // remove redundant rows
    if (isredundant) {
      numrowsremoved++;
      postsolve_stack.redundantRow(row);
      removeRow(row);
      coefficients.clear();
      HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
      continue;
    }

    // skip rows with empty coefficient map
    if (coefficients.empty()) continue;

    // vector to hold best clique
    std::vector<liftingvar> bestclique;
    double bestscore = -kHighsInf;
    HighsInt bestnfill = 0;

    // lambda for computing coefficient difference
    auto computeCoeffDiff = [&](double newvalue, HighsInt nzpos) {
      return std::fabs(newvalue - (nzpos == -1 ? 0 : Avalue[nzpos]));
    };

    // store candidates in a vector
    std::vector<HighsCliqueTable::CliqueVar> candidates;
    candidates.reserve(coefficients.size());
    for (const auto& elm : coefficients) {
      candidates.push_back(elm.first);
      // initialize best clique
      double score = computeCoeffDiff(elm.second.first, elm.second.second);
      if (score > bestscore) {
        bestscore = score;
        bestnfill = elm.second.second == -1 ? 1 : 0;
        bestclique = {std::make_pair(elm.first, elm.second.first)};
      }
    }

    if (candidates.size() > 1) {
      // compute cliques
      auto cliques =
          cliquetable.computeMaximalCliques(candidates, primal_feastol);

      // identify clique with highest score
      for (const auto& clique : cliques) {
        HighsCDouble score = 0;
        HighsInt nfill = 0;
        for (const auto& cliquevar : clique) {
          score += computeCoeffDiff(coefficients[cliquevar].first,
                                    coefficients[cliquevar].second);
          if (coefficients[cliquevar].second == -1) nfill++;
        }
        if (score > bestscore) {
          bestscore = static_cast<double>(score);
          bestnfill = nfill;
          bestclique.clear();
          bestclique.reserve(clique.size());
          for (const auto& cliquevar : clique) {
            bestclique.emplace_back(cliquevar, coefficients[cliquevar].first);
          }
        }
      }
    }

    // store best clique
    liftingtable.emplace_back(row, bestclique, bestscore, bestnfill);
    bestscoretotal = std::max(bestscoretotal, bestscore);
    coefficients.clear();
  }

  // lambda for computing score
  auto computeOverallScore = [&](double score, HighsInt numelms,
                                 HighsInt numfillin) {
    const double weight = 0.5;
    return weight * (score / bestscoretotal) +
           (1 - weight) * static_cast<double>(numelms - numfillin) /
               static_cast<double>(numelms);
  };

  // sort according to score
  pdqsort(
      liftingtable.begin(), liftingtable.end(),
      [&](const liftingdata& opp1, const liftingdata& opp2) {
        double score1 = computeOverallScore(
            std::get<2>(opp1), static_cast<HighsInt>(std::get<1>(opp1).size()),
            std::get<3>(opp1));
        double score2 = computeOverallScore(
            std::get<2>(opp2), static_cast<HighsInt>(std::get<1>(opp2).size()),
            std::get<3>(opp2));
        return (score1 == score2 ? std::get<0>(opp1) < std::get<0>(opp2)
                                 : score1 > score2);
      });

  // perform actual lifting
  size_t nfill = 0;
  size_t nmod = 0;
  size_t numrowsmodified = 0;
  const size_t maxnfill = std::max(10 * liftingtable.size(),
                                   static_cast<size_t>(numNonzeros()) / 100);
  for (const auto& lifting : liftingtable) {
    // get clique
    HighsInt row = std::get<0>(lifting);
    const auto& bestclique = std::get<1>(lifting);

    // check against max. fill-in
    size_t newfill = static_cast<size_t>(std::get<3>(lifting));
    if (nfill + newfill > maxnfill) break;
    nfill += newfill;
    nmod += bestclique.size() - newfill;

    // update matrix
    HighsCDouble update = 0.0;
    for (const auto& elm : bestclique) {
      // get data
      const auto& cliquevar = std::get<0>(elm);
      const double& coeff = std::get<1>(elm);
      // add non-zero to matrix
      addToMatrix(row, cliquevar.col, coeff);
      // compute term to update left-hand / right-hand side
      if (cliquevar.val == 0) update += coeff;
    }

    // update left-hand / right-hand sides
    numrowsmodified++;
    if (model->row_lower_[row] != -kHighsInf)
      model->row_lower_[row] += static_cast<double>(update);
    if (model->row_upper_[row] != kHighsInf)
      model->row_upper_[row] += static_cast<double>(update);
  }

  highsLogDev(options->log_options, HighsLogType::kInfo,
              "Lifting for probing removed %d and modified %d row(s), added %d "
              "new and modified %d existing nonzero(s)\n",
              static_cast<int>(numrowsremoved),
              static_cast<int>(numrowsmodified), static_cast<int>(nfill),
              static_cast<int>(nmod));

  return Result::kOk;
}